

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O1

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,
          ArenaAllocator *allocator,Char kc,unsigned_long v)

{
  Type pNVar1;
  uint i;
  undefined6 in_register_00000012;
  
  i = (uint)CONCAT62(in_register_00000012,kc);
  if (i < 0x100) {
    BVStatic<256UL>::Set(&this->isInMap,i);
    this->directMap[(ushort)kc] = v;
    return;
  }
  if (this->root == (Type)0x0) {
    if (this->defv == v) {
      return;
    }
    pNVar1 = (Type)new<Memory::ArenaAllocator>(0x88,allocator,0x366bee);
    pNVar1->_vptr_Node = (_func_int **)&PTR_FreeSelf_01559ac0;
    pNVar1[1]._vptr_Node = (_func_int **)0x0;
    pNVar1[2]._vptr_Node = (_func_int **)0x0;
    pNVar1[3]._vptr_Node = (_func_int **)0x0;
    pNVar1[4]._vptr_Node = (_func_int **)0x0;
    pNVar1[5]._vptr_Node = (_func_int **)0x0;
    pNVar1[6]._vptr_Node = (_func_int **)0x0;
    pNVar1[7]._vptr_Node = (_func_int **)0x0;
    pNVar1[8]._vptr_Node = (_func_int **)0x0;
    pNVar1[9]._vptr_Node = (_func_int **)0x0;
    pNVar1[10]._vptr_Node = (_func_int **)0x0;
    pNVar1[0xb]._vptr_Node = (_func_int **)0x0;
    pNVar1[0xc]._vptr_Node = (_func_int **)0x0;
    pNVar1[0xd]._vptr_Node = (_func_int **)0x0;
    pNVar1[0xe]._vptr_Node = (_func_int **)0x0;
    pNVar1[0xf]._vptr_Node = (_func_int **)0x0;
    pNVar1[0x10]._vptr_Node = (_func_int **)0x0;
    this->root = pNVar1;
  }
  (*this->root->_vptr_Node[1])
            (this->root,allocator,this->defv,3,CONCAT62(in_register_00000012,kc) & 0xffffffff,v);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, Char kc, V v)
        {
            uint k = CTU(kc);
            if (k < directSize)
            {
                isInMap.Set(k);
                directMap[k] = v;
            }
            else
            {
                if (root == 0)
                {
                    if (v == defv)
                        return;
                    root = Anew(allocator, Inner);
                }
                root->Set(allocator, defv, levels - 1, k, v);
            }
        }